

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyimpl.cpp
# Opt level: O3

void __thiscall QNetworkReplyImplPrivate::_q_startOperation(QNetworkReplyImplPrivate *this)

{
  int *piVar1;
  QDebug this_00;
  char cVar2;
  bool bVar3;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  QAnyStringView QVar5;
  QDebug local_80;
  int local_78;
  QChar local_70;
  InternalNotifications local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined8 uStack_5c;
  undefined4 local_54;
  char *local_50;
  QUrl local_48;
  undefined1 local_40 [8];
  QArrayData *local_38 [3];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->state & ~Buffering) == Working) {
    local_68 = 2;
    uStack_64 = 0;
    uStack_60 = 0;
    uStack_5c = 0;
    local_54 = 0;
    local_50 = "default";
    QMessageLogger::debug();
    this_00.stream = local_80.stream;
    QVar4.m_data = (storage_type *)0x3e;
    QVar4.m_size = (qsizetype)local_38;
    QString::fromUtf8(QVar4);
    QTextStream::operator<<((QTextStream *)this_00.stream,(QString *)local_38);
    if (local_38[0] != (QArrayData *)0x0) {
      LOCK();
      (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_38[0],2,0x10);
      }
    }
    if ((char)(((QArrayData *)(local_80.stream + 0x30))->ref_)._q_value.super___atomic_base<int>.
              _M_i == '\x01') {
      QTextStream::operator<<((QTextStream *)local_80.stream,' ');
    }
    *(int *)&((QArrayData *)((long)local_80.stream + 0x20))->alloc =
         (int)((QArrayData *)((long)local_80.stream + 0x20))->alloc + 1;
    ::operator<<((Stream *)local_40,&local_48);
    QDebug::~QDebug((QDebug *)local_40);
    QDebug::~QDebug((QDebug *)&local_48);
    QDebug::~QDebug(&local_80);
  }
  else {
    this->state = Working;
    if (this->backend == (QNetworkAccessBackend *)0x0) {
      QCoreApplication::translate((char *)local_38,"QNetworkReply","Protocol \"%1\" is unknown",0);
      QUrl::scheme();
      QVar5.m_size = (size_t)local_38;
      QVar5.field_0.m_data = &local_68;
      QString::arg_impl(QVar5,local_78,local_70);
      error(this,ProtocolUnknownError,(QString *)&local_68);
      piVar1 = (int *)CONCAT44(uStack_64,local_68);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(uStack_64,local_68),2,0x10);
        }
      }
      if ((QArrayData *)local_80.stream != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_80.stream = *(int *)local_80.stream + -1;
        UNLOCK();
        if (*(int *)local_80.stream == 0) {
          QArrayData::deallocate((QArrayData *)local_80.stream,2,0x10);
        }
      }
      if (local_38[0] != (QArrayData *)0x0) {
        LOCK();
        (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_38[0],2,0x10);
        }
      }
      finished(this);
    }
    else {
      cVar2 = (**(code **)(*(long *)this->backend + 0x60))();
      if (cVar2 == '\0') {
        _q_startOperation();
      }
      else {
        QElapsedTimer::start();
        QElapsedTimer::invalidate();
        if ((QNetworkAccessBackend *)this->backend != (QNetworkAccessBackend *)0x0) {
          bVar3 = QNetworkAccessBackend::isSynchronous((QNetworkAccessBackend *)this->backend);
          if (bVar3) {
            this->state = Finished;
            if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
              QNetworkReply::setFinished
                        (*(QNetworkReply **)&(this->super_QNetworkReplyPrivate).field_0x8,true);
              return;
            }
            goto LAB_001986b1;
          }
        }
        if (this->state != Finished) {
          if ((this->super_QNetworkReplyPrivate).operation == GetOperation) {
            local_68 = NotifyDownstreamReadyWrite;
            std::
            vector<QNetworkReplyImplPrivate::InternalNotifications,_std::allocator<QNetworkReplyImplPrivate::InternalNotifications>_>
            ::emplace_back<QNetworkReplyImplPrivate::InternalNotifications>
                      (&this->pendingNotifications,&local_68);
          }
          handleNotifications(this);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
LAB_001986b1:
  __stack_chk_fail();
}

Assistant:

void QNetworkReplyImplPrivate::_q_startOperation()
{
    // ensure this function is only being called once
    if (state == Working || state == Finished) {
        qDebug() << "QNetworkReplyImpl::_q_startOperation was called more than once" << url;
        return;
    }
    state = Working;

    // note: if that method is called directly, it cannot happen that the backend is 0,
    // because we just checked via a qobject_cast that we got a http backend (see
    // QNetworkReplyImplPrivate::setup())
    if (!backend) {
        error(QNetworkReplyImpl::ProtocolUnknownError,
              QCoreApplication::translate("QNetworkReply", "Protocol \"%1\" is unknown").arg(url.scheme())); // not really true!;
        finished();
        return;
    }

    if (!backend->start()) {
        qWarning("Backend start failed");
        state = Working;
        error(QNetworkReplyImpl::UnknownNetworkError,
              QCoreApplication::translate("QNetworkReply", "backend start error."));
        finished();
        return;
    }

    // Prepare timer for progress notifications
    downloadProgressSignalChoke.start();
    uploadProgressSignalChoke.invalidate();

    if (backend && backend->isSynchronous()) {
        state = Finished;
        q_func()->setFinished(true);
    } else {
        if (state != Finished) {
            if (operation == QNetworkAccessManager::GetOperation)
                pendingNotifications.push_back(NotifyDownstreamReadyWrite);

            handleNotifications();
        }
    }
}